

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_1f2fc0e::File::~File(File *this)

{
  int in_ESI;
  
  (this->super_ReaderWriter).super_Reader = (Reader)&PTR__File_0093bfe0;
  (this->super_ReaderWriter).super_Writer = (Writer)&PTR__File_0093c040;
  close(this,in_ESI);
  return;
}

Assistant:

~File() { close(); }